

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_total_records(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  char *pcVar2;
  unqlite_col *puVar3;
  int iFlag;
  uint uVar4;
  jx9_vm *pVm;
  anon_union_8_3_18420de5_for_x aVar5;
  int nByte;
  SyString sName;
  uint local_2c;
  SyString local_28;
  
  if (argc < 1) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar2 = "Missing collection name";
LAB_0011844a:
    jx9VmThrowError(pVm,&pjVar1->sName,1,pcVar2);
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,(int *)&local_2c);
    if ((int)local_2c < 1) {
      pjVar1 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar2 = "Invalid collection name";
      goto LAB_0011844a;
    }
    local_28.nByte = local_2c;
    local_28.zString = pcVar2;
    puVar3 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_28,iFlag);
    if (puVar3 != (unqlite_col *)0x0) {
      aVar5 = (anon_union_8_3_18420de5_for_x)puVar3->nTotRec;
      uVar4 = 2;
      goto LAB_0011845c;
    }
  }
  uVar4 = 8;
  aVar5.rVal = 0.0;
LAB_0011845c:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar5;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar4;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_total_records(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		unqlite_int64 nRec;
		nRec = unqliteCollectionTotalRecords(pCol);
		jx9_result_int64(pCtx,nRec);
	}else{
		/* No such collection */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}